

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::ExecNullMove<true>(Node *this,Node *dest)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->state;
  if ((uVar1 & 1) == 0) {
    __assert_fail("COLOR(state) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xbc2,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
  }
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xbc3,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
  }
  if (dest == this) {
    __assert_fail("&dest != this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xbc4,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
  }
  _stats._152_8_ = _stats._152_8_ + 1;
  dest->state = uVar1 & 0xfffffffe;
  dest->ep = 0x78;
  dest->rcount = this->rcount;
  dest->mcount = this->mcount;
  uVar2 = this->pawnKey;
  dest->pawnKey = uVar2;
  uVar3 = this->pieceKey;
  dest->pieceKey = uVar3;
  dest->positionKey = uVar2 ^ uVar3 ^ *(ulong *)(_HASH + (ulong)(uVar1 & 0x1e) * 8);
  (dest->lastMove).bits = 0;
  (dest->lastMove).score = 0;
  dest->standPat = _material - DAT_00169914;
  if (this->ply + -32000 < this->standPat) {
    dest->checks = 0;
    return;
  }
  __assert_fail("standPat > (ply - Infinity)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0xbd5,"void clunk::Node::ExecNullMove(Node &) const [color = true]");
}

Assistant:

inline void ExecNullMove(Node& dest) const {
    assert(COLOR(state) == color);
    assert(!checks);
    assert(&dest != this);

    _stats.nullMoves++;

    dest.state = (state ^ 1);
    dest.ep = None;
    dest.rcount = rcount;
    dest.mcount = mcount;
    dest.pawnKey = pawnKey;
    dest.pieceKey = pieceKey;
    dest.positionKey = (dest.pawnKey ^
                        dest.pieceKey ^
                        _HASH[0][dest.state & 0x1F] ^
                        _HASH[1][dest.ep]);

    dest.lastMove.Clear();
    dest.standPat = (_material[!color] - _material[color]);
    assert(standPat > (ply - Infinity));
    dest.checks = 0;

#if 0
    assert(VerifyAttacks(true));
#endif
  }